

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::LJoint::Prepare(LJoint *this,btScalar dt,int iterations)

{
  Body *this_00;
  Body *this_01;
  undefined8 uVar1;
  btRigidBody *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  btTransform *pbVar7;
  btMatrix3x3 *iia;
  btScalar *pbVar8;
  btMatrix3x3 *iib;
  btScalar bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btScalar bVar15;
  float fVar16;
  float fVar17;
  btMatrix3x3 local_60;
  
  this_00 = (this->super_Joint).m_bodies;
  Body::activate(this_00);
  this_01 = (this->super_Joint).m_bodies + 1;
  Body::activate(this_01);
  pbVar7 = Body::xform(this_00);
  fVar13 = (this->super_Joint).m_refs[0].m_floats[0];
  fVar11 = (this->super_Joint).m_refs[0].m_floats[1];
  fVar14 = (this->super_Joint).m_refs[0].m_floats[2];
  uVar1 = *(undefined8 *)(pbVar7->m_origin).m_floats;
  auVar5._4_4_ = (float)((ulong)uVar1 >> 0x20) +
                 (pbVar7->m_basis).m_el[1].m_floats[2] * fVar14 +
                 (pbVar7->m_basis).m_el[1].m_floats[0] * fVar13 +
                 (pbVar7->m_basis).m_el[1].m_floats[1] * fVar11;
  auVar5._0_4_ = (float)uVar1 +
                 (pbVar7->m_basis).m_el[0].m_floats[2] * fVar14 +
                 (pbVar7->m_basis).m_el[0].m_floats[0] * fVar13 +
                 (pbVar7->m_basis).m_el[0].m_floats[1] * fVar11;
  auVar5._8_4_ = (pbVar7->m_basis).m_el[2].m_floats[2] * fVar14 +
                 (pbVar7->m_basis).m_el[2].m_floats[0] * fVar13 +
                 (pbVar7->m_basis).m_el[2].m_floats[1] * fVar11 + (pbVar7->m_origin).m_floats[2];
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])this->m_rpos[0].m_floats = auVar5;
  pbVar7 = Body::xform(this_01);
  fVar13 = (this->super_Joint).m_refs[1].m_floats[0];
  fVar11 = (this->super_Joint).m_refs[1].m_floats[1];
  fVar14 = (this->super_Joint).m_refs[1].m_floats[2];
  fVar10 = (pbVar7->m_basis).m_el[2].m_floats[2] * fVar14 +
           (pbVar7->m_basis).m_el[2].m_floats[0] * fVar13 +
           (pbVar7->m_basis).m_el[2].m_floats[1] * fVar11 + (pbVar7->m_origin).m_floats[2];
  uVar1 = *(undefined8 *)(pbVar7->m_origin).m_floats;
  fVar12 = (float)uVar1 +
           (pbVar7->m_basis).m_el[0].m_floats[2] * fVar14 +
           (pbVar7->m_basis).m_el[0].m_floats[0] * fVar13 +
           (pbVar7->m_basis).m_el[0].m_floats[1] * fVar11;
  fVar13 = (float)((ulong)uVar1 >> 0x20) +
           (pbVar7->m_basis).m_el[1].m_floats[2] * fVar14 +
           (pbVar7->m_basis).m_el[1].m_floats[0] * fVar13 +
           (pbVar7->m_basis).m_el[1].m_floats[1] * fVar11;
  auVar3._4_4_ = fVar13;
  auVar3._0_4_ = fVar12;
  auVar3._8_4_ = fVar10;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])this->m_rpos[1].m_floats = auVar3;
  uVar1 = *(undefined8 *)this->m_rpos[0].m_floats;
  fVar12 = (float)uVar1 - fVar12;
  fVar13 = (float)((ulong)uVar1 >> 0x20) - fVar13;
  fVar10 = this->m_rpos[0].m_floats[2] - fVar10;
  fVar11 = fVar10 * fVar10 + fVar12 * fVar12 + fVar13 * fVar13;
  if (16.0 < fVar11) {
    fVar11 = 1.0 / SQRT(fVar11);
    fVar10 = fVar10 * 4.0 * fVar11;
    fVar12 = fVar12 * 4.0 * fVar11;
    fVar13 = fVar13 * 4.0 * fVar11;
  }
  fVar11 = (this->super_Joint).m_erp;
  fVar14 = 1.0 / dt;
  auVar4._4_4_ = fVar14 * fVar11 * fVar13;
  auVar4._0_4_ = fVar14 * fVar11 * fVar12;
  auVar4._8_4_ = fVar14 * fVar10 * fVar11;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_Joint).m_drift.m_floats = auVar4;
  pbVar7 = Body::xform(this_00);
  fVar13 = this->m_rpos[0].m_floats[1];
  this->m_rpos[0].m_floats[0] = this->m_rpos[0].m_floats[0] - (pbVar7->m_origin).m_floats[0];
  this->m_rpos[0].m_floats[1] = fVar13 - (pbVar7->m_origin).m_floats[1];
  this->m_rpos[0].m_floats[2] = this->m_rpos[0].m_floats[2] - (pbVar7->m_origin).m_floats[2];
  pbVar7 = Body::xform(this_01);
  fVar13 = this->m_rpos[1].m_floats[1];
  this->m_rpos[1].m_floats[0] = this->m_rpos[1].m_floats[0] - (pbVar7->m_origin).m_floats[0];
  this->m_rpos[1].m_floats[1] = fVar13 - (pbVar7->m_origin).m_floats[1];
  this->m_rpos[1].m_floats[2] = this->m_rpos[1].m_floats[2] - (pbVar7->m_origin).m_floats[2];
  pbVar2 = (this->super_Joint).m_bodies[0].m_rigid;
  if (pbVar2 == (btRigidBody *)0x0) {
    if (this_00->m_soft != (Cluster *)0x0) {
      pbVar8 = &this_00->m_soft->m_imass;
      goto LAB_001decfa;
    }
    bVar15 = 0.0;
  }
  else {
    pbVar8 = &pbVar2->m_inverseMass;
LAB_001decfa:
    bVar15 = *pbVar8;
  }
  iia = Body::invWorldInertia(this_00);
  pbVar2 = (this->super_Joint).m_bodies[1].m_rigid;
  if (pbVar2 == (btRigidBody *)0x0) {
    if (this_01->m_soft == (Cluster *)0x0) {
      bVar9 = 0.0;
      goto LAB_001ded43;
    }
    pbVar8 = &this_01->m_soft->m_imass;
  }
  else {
    pbVar8 = &pbVar2->m_inverseMass;
  }
  bVar9 = *pbVar8;
LAB_001ded43:
  iib = Body::invWorldInertia(this_01);
  ImpulseMatrix(&local_60,bVar15,iia,this->m_rpos,bVar9,iib,this->m_rpos + 1);
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[0].m_floats = local_60.m_el[0].m_floats._0_8_
  ;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[0].m_floats + 2) =
       local_60.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[1].m_floats = local_60.m_el[1].m_floats._0_8_
  ;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[1].m_floats + 2) =
       local_60.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[2].m_floats = local_60.m_el[2].m_floats._0_8_
  ;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[2].m_floats + 2) =
       local_60.m_el[2].m_floats._8_8_;
  fVar13 = (this->super_Joint).m_split;
  fVar11 = (this->super_Joint).m_drift.m_floats[0];
  if (fVar13 <= 0.0) {
    bVar15 = (this->super_Joint).m_drift.m_floats[2];
    bVar9 = (this->super_Joint).m_drift.m_floats[1];
  }
  else {
    fVar10 = fVar13 * fVar11;
    fVar14 = (this->super_Joint).m_drift.m_floats[1];
    fVar12 = (this->super_Joint).m_drift.m_floats[2];
    fVar17 = fVar13 * fVar14;
    fVar16 = fVar13 * fVar12;
    auVar6._4_4_ = fVar16 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
                   fVar10 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
                   (this->super_Joint).m_massmatrix.m_el[1].m_floats[1] * fVar17;
    auVar6._0_4_ = fVar16 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] +
                   fVar10 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
                   (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] * fVar17;
    auVar6._8_4_ = fVar16 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[2] +
                   fVar10 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] +
                   fVar17 * (this->super_Joint).m_massmatrix.m_el[2].m_floats[1];
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])(this->super_Joint).m_sdrift.m_floats = auVar6;
    fVar13 = 1.0 - fVar13;
    fVar11 = fVar11 * fVar13;
    bVar9 = fVar14 * fVar13;
    bVar15 = fVar13 * fVar12;
  }
  fVar13 = 1.0 / (float)iterations;
  *(ulong *)(this->super_Joint).m_drift.m_floats = CONCAT44(fVar13 * bVar9,fVar13 * fVar11);
  (this->super_Joint).m_drift.m_floats[2] = fVar13 * bVar15;
  return;
}

Assistant:

void				btSoftBody::LJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=4;
	Joint::Prepare(dt,iterations);
	m_rpos[0]		=	m_bodies[0].xform()*m_refs[0];
	m_rpos[1]		=	m_bodies[1].xform()*m_refs[1];
	m_drift			=	Clamp(m_rpos[0]-m_rpos[1],maxdrift)*m_erp/dt;
	m_rpos[0]		-=	m_bodies[0].xform().getOrigin();
	m_rpos[1]		-=	m_bodies[1].xform().getOrigin();
	m_massmatrix	=	ImpulseMatrix(	m_bodies[0].invMass(),m_bodies[0].invWorldInertia(),m_rpos[0],
		m_bodies[1].invMass(),m_bodies[1].invWorldInertia(),m_rpos[1]);
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}